

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  long lVar1;
  string *psVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  istream *this;
  reference pvVar6;
  ostream *this_00;
  undefined8 uStack_130;
  char *local_128;
  long local_120;
  string *local_118;
  istream *local_110;
  ulong local_108;
  long local_100;
  value_type local_f8;
  pos_t p_1;
  int local_e4;
  pair<int,_int> local_e0;
  int local_d8;
  pair<int,_int> local_d4;
  int local_cc;
  pair<int,_int> local_c8;
  value_type local_c0;
  pos_t p;
  undefined1 local_b0 [8];
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> lake;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> to_process;
  int result;
  int Y;
  int X;
  int i_1;
  int N;
  int j;
  int l;
  string local_58 [8];
  string row;
  int local_34;
  int i;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint local_14;
  uint local_10;
  int H;
  int W;
  
  H = 0;
  local_110 = (istream *)&std::cin;
  uStack_130 = 0x1032e9;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_10);
  uStack_130 = 0x1032f5;
  std::istream::ignore();
  uStack_130 = 0x103305;
  std::istream::operator>>(local_110,(int *)&local_14);
  uStack_130 = 0x103311;
  std::istream::ignore();
  local_108 = (ulong)local_14;
  lVar1 = -(local_10 * local_108 * 4 + 0xf & 0xfffffffffffffff0);
  local_100 = (long)&local_128 + lVar1;
  local_34 = 0;
  while( true ) {
    if ((int)local_14 <= local_34) {
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1034b9;
      std::istream::operator>>((istream *)&std::cin,&X);
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1034c5;
      std::istream::ignore();
      for (Y = 0; Y < X; Y = Y + 1) {
        *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1034e8;
        this = (istream *)std::istream::operator>>((istream *)&std::cin,&result);
        *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1034f4;
        std::istream::operator>>
                  (this,(int *)((long)&to_process.
                                       super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl._M_node._M_size + 4));
        *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103500;
        std::istream::ignore();
        if (*(int *)(local_100 + (long)result * local_108 * 4 +
                    (long)to_process.
                          super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl._M_node._M_size._4_4_ * 4) == -1) {
          to_process.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl._M_node._M_size._0_4_ = 0;
          *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103542;
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
                    ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &lake.
                      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                      _M_impl._M_node._M_size);
          *(undefined8 *)((long)&uStack_130 + lVar1) = 0x10354e;
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
                    ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_b0);
          *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103562;
          std::pair<int,_int>::pair<int_&,_int_&,_true>
                    (&p,&result,
                     (int *)((long)&to_process.
                                    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl._M_node._M_size + 4));
          *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103577;
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &lake.
                      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                      _M_impl._M_node._M_size,&p);
          while( true ) {
            *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103587;
            bVar4 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    empty((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &lake.
                           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl._M_node._M_size);
            if (((bVar4 ^ 0xffU) & 1) == 0) break;
            *(undefined8 *)((long)&uStack_130 + lVar1) = 0x10359e;
            pvVar6 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                     ::front((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             &lake.
                              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl._M_node._M_size);
            local_c0 = *pvVar6;
            *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1035b4;
            std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            pop_front((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      &lake.
                       super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                       _M_impl._M_node._M_size);
            if (*(int *)(local_100 + (long)local_c0.first * local_108 * 4 +
                        (long)local_c0.second * 4) == -1) {
              to_process.
              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
              _M_node._M_size._0_4_ =
                   (int)to_process.
                        super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl._M_node._M_size + 1;
              *(int *)(local_100 + (long)local_c0.first * local_108 * 4 + (long)local_c0.second * 4)
                   = (int)to_process.
                          super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl._M_node._M_size;
              *(undefined8 *)((long)&uStack_130 + lVar1) = 0x10362e;
              std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
              push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_b0
                        ,&local_c0);
              if (0 < local_c0.first) {
                local_cc = local_c0.first + -1;
                *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103662;
                std::pair<int,_int>::pair<int,_true>(&local_c8,&local_cc,&local_c0.second);
                *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103677;
                std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &lake.
                           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl._M_node._M_size,&local_c8);
              }
              if (0 < local_c0.second) {
                local_d8 = local_c0.second + -1;
                *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1036d6;
                std::pair<int,_int>::pair<int,_true>(&local_d4,&local_c0.first,&local_d8);
                *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1036eb;
                std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &lake.
                           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl._M_node._M_size,&local_d4);
              }
              if (local_c0.first < (int)(local_10 - 1)) {
                local_e4 = local_c0.first + 1;
                *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103727;
                std::pair<int,_int>::pair<int,_true>(&local_e0,&local_e4,&local_c0.second);
                *(undefined8 *)((long)&uStack_130 + lVar1) = 0x10373c;
                std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &lake.
                           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl._M_node._M_size,&local_e0);
              }
              if (local_c0.second < (int)(local_14 - 1)) {
                p_1.first = local_c0.second + 1;
                *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103778;
                std::pair<int,_int>::pair<int,_true>
                          ((pair<int,_int> *)&p_1.second,&local_c0.first,&p_1.first);
                *(undefined8 *)((long)&uStack_130 + lVar1) = 0x10378d;
                std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &lake.
                           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl._M_node._M_size,(value_type *)&p_1.second);
              }
            }
          }
          while( true ) {
            *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1037a6;
            bVar4 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    empty((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          local_b0);
            if (((bVar4 ^ 0xffU) & 1) == 0) break;
            *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1037ba;
            pvVar6 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                     ::front((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             local_b0);
            local_f8 = *pvVar6;
            *(int *)(local_100 + (long)local_f8.first * local_108 * 4 + (long)local_f8.second * 4) =
                 (int)to_process.
                      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                      _M_impl._M_node._M_size;
            *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103800;
            std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            pop_front((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_b0);
          }
          *(undefined8 *)((long)&uStack_130 + lVar1) = 0x10380e;
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                    ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_b0);
          *(undefined8 *)((long)&uStack_130 + lVar1) = 0x10381a;
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                    ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &lake.
                      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                      _M_impl._M_node._M_size);
        }
        else {
          to_process.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl._M_node._M_size._0_4_ =
               *(int *)(local_100 + (long)result * local_108 * 4 +
                       (long)to_process.
                             super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl._M_node._M_size._4_4_ * 4);
        }
        iVar3 = (int)to_process.
                     super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl._M_node._M_size;
        *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103852;
        this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103861;
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      return 0;
    }
    local_118 = local_58;
    *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103375;
    std::__cxx11::string::string(local_58);
    psVar2 = local_118;
    *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103388;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,psVar2);
    local_120 = (long)(int)local_10;
    *(undefined8 *)((long)&uStack_130 + lVar1) = 0x10339e;
    lVar5 = std::__cxx11::string::length();
    if (local_120 != lVar5) break;
    *(undefined8 *)((long)&uStack_130 + lVar1) = 0x1033f1;
    N = std::__cxx11::string::length();
    for (i_1 = 0; i_1 < N; i_1 = i_1 + 1) {
      *(undefined8 *)((long)&uStack_130 + lVar1) = 0x103414;
      local_128 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
      if (*local_128 == 'O') {
        *(undefined4 *)(local_100 + (long)i_1 * local_108 * 4 + (long)local_34 * 4) = 0xffffffff;
      }
      else {
        *(undefined4 *)(local_100 + (long)i_1 * local_108 * 4 + (long)local_34 * 4) = 0;
      }
    }
    *(undefined8 *)((long)&uStack_130 + lVar1) = 0x10349b;
    std::__cxx11::string::~string(local_58);
    local_34 = local_34 + 1;
  }
  *(undefined1 **)((long)&uStack_130 + lVar1) = &LAB_001033ce;
  __assert_fail("static_cast<size_t>(W) == row.length()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/surface/main.cpp"
                ,0x1b,"int main()");
}

Assistant:

int main()
{
	int W;
	int H;
	std::cin >> W;
	std::cin.ignore();
	std::cin >> H;
	std::cin.ignore();

typedef std::pair<int, int> pos_t;
    int surf[W][H];
	for (int i = 0; i < H; i++)
	{
	    std::string row;
	    std::getline(std::cin, row);
	    assert(static_cast<size_t>(W) == row.length());
	    int l = row.length();
	    for (int j = 0; j < l; j++)
	    {
	        if ('O' == row[j])
	        {
	            surf[j][i] = -1;
	        }
	        else
	        {
	            surf[j][i] = 0;
	        }
	    }
	}
	
    // Tests
    int N;
    std::cin >> N;
    std::cin.ignore();
	for (int i = 0; i < N; i++)
	{
	    int X;
	    int Y;
	    std::cin >> X >> Y;
	    std::cin.ignore();
	    
	    int result;
	    if (-1 == surf[X][Y])
	    {
	        // Fill
	        result = 0;
	        std::list<pos_t> to_process;
	        std::list<pos_t> lake;
	        
	        to_process.push_back(pos_t(X, Y));
	        while (!to_process.empty())
	        {
	            const pos_t p = to_process.front();
	            to_process.pop_front();
	            if (-1 == surf[p.first][p.second])
	            {
	                result++;
	                surf[p.first][p.second] = result;
	                lake.push_back(p);
	                
	                if (0 < p.first)
	                {
	                    to_process.push_back(pos_t(p.first - 1, p.second));
	                }
	                if (0 < p.second)
	                {
	                    to_process.push_back(pos_t(p.first, p.second - 1));
	                }
	                if (p.first < W - 1)
	                {
	                    to_process.push_back(pos_t(p.first + 1, p.second));
	                }
	                if (p.second < H - 1)
	                {
	                    to_process.push_back(pos_t(p.first, p.second + 1));
	                }
	            }
	        }
	        
	        while (!lake.empty())
	        {
	            const pos_t p = lake.front();
	            surf[p.first][p.second] = result;
	            lake.pop_front();
	        }
	    }
	    else
	    {
	        result = surf[X][Y];
	    }
	    std::cout << result << std::endl;
	}

	return 0;
}